

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_compute_shared
              (mbedtls_ecp_group *grp,mbedtls_mpi *z,mbedtls_ecp_point *Q,mbedtls_mpi *d,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 local_88 [8];
  mbedtls_ecp_point P;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *z_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_88);
  P.Z.p._4_4_ = mbedtls_ecp_check_pubkey(grp,Q);
  if ((P.Z.p._4_4_ == 0) &&
     (P.Z.p._4_4_ = mbedtls_ecp_mul(grp,(mbedtls_ecp_point *)local_88,d,Q,f_rng,p_rng),
     P.Z.p._4_4_ == 0)) {
    iVar1 = mbedtls_ecp_is_zero((mbedtls_ecp_point *)local_88);
    if (iVar1 == 0) {
      P.Z.p._4_4_ = mbedtls_mpi_copy(z,(mbedtls_mpi *)local_88);
    }
    else {
      P.Z.p._4_4_ = -0x4f80;
    }
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_88);
  return P.Z.p._4_4_;
}

Assistant:

int mbedtls_ecdh_compute_shared( mbedtls_ecp_group *grp, mbedtls_mpi *z,
                         const mbedtls_ecp_point *Q, const mbedtls_mpi *d,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng )
{
    int ret;
    mbedtls_ecp_point P;

    mbedtls_ecp_point_init( &P );

    /*
     * Make sure Q is a valid pubkey before using it
     */
    MBEDTLS_MPI_CHK( mbedtls_ecp_check_pubkey( grp, Q ) );

    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( grp, &P, d, Q, f_rng, p_rng ) );

    if( mbedtls_ecp_is_zero( &P ) )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( z, &P.X ) );

cleanup:
    mbedtls_ecp_point_free( &P );

    return( ret );
}